

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgpfd(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,double *array,char *nularray,
          int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_60;
  int nullcheck;
  long row;
  char *nularray_local;
  double *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    local_60 = group;
    if (group < 1) {
      local_60 = 1;
    }
    ffgcld(fptr,2,local_60,firstelem,nelem,1,2,0.0,array,nularray,anynul,status);
    fptr_local._4_4_ = *status;
  }
  else {
    fits_read_compressed_pixels
              (fptr,0x52,firstelem,nelem,2,(void *)0x0,array,nularray,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpfd( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            double *array,    /* O - array of values that are returned       */
            char *nularray,   /* O - array of null pixel flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Any undefined pixels in the returned array will be set = 0 and the 
  corresponding nularray value will be set = 1.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    int nullcheck = 2;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, TDOUBLE, firstelem, nelem,
            nullcheck, NULL, array, nularray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcld(fptr, 2, row, firstelem, nelem, 1, 2, 0.,
               array, nularray, anynul, status);
    return(*status);
}